

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O3

void __thiscall
MinVR::VRParseCommandLine::help
          (VRParseCommandLine *this,VRSearchConfig *configPath,string *additionalText)

{
  pointer pcVar1;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  pcVar1 = (additionalText->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + additionalText->_M_string_length);
  makeHelpString(&local_60,this,configPath,&local_40);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void help(VRSearchConfig &configPath, const std::string additionalText = "") {
    std::cerr << makeHelpString(configPath, additionalText) << std::endl;
  }